

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Declarations.cpp
# Opt level: O1

bool __thiscall
psy::C::Parser::parseExtGNU_AttributeSpecifier_AtFirst(Parser *this,SpecifierSyntax **spec)

{
  bool bVar1;
  SyntaxToken *pSVar2;
  ExtGNU_AttributeSpecifierSyntax *pEVar3;
  IndexType IVar4;
  ostream *poVar5;
  
  pSVar2 = peek(this,1);
  if (pSVar2->syntaxK_ == KeywordAlias___attribute) {
    pEVar3 = makeNode<psy::C::ExtGNU_AttributeSpecifierSyntax>(this);
    *spec = &pEVar3->super_SpecifierSyntax;
    IVar4 = consume(this);
    pEVar3->attrKwTkIdx_ = IVar4;
    bVar1 = match(this,OpenParenToken,&pEVar3->openOuterParenTkIdx_);
    if ((((bVar1) && (bVar1 = match(this,OpenParenToken,&pEVar3->openInnerParenTkIdx_), bVar1)) &&
        (bVar1 = parseExtGNU_AttributeList(this,&pEVar3->attrs_), bVar1)) &&
       ((bVar1 = match(this,CloseParenToken,&pEVar3->closeInnerParenTkIdx_), bVar1 &&
        (bVar1 = match(this,CloseParenToken,&pEVar3->closeOuterParenTkIdx_), bVar1)))) {
      return true;
    }
    skipTo(this,CloseParenToken);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Declarations.cpp"
               ,100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x66c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"assert failure: `__attribute__\'",0x1f);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  return false;
}

Assistant:

bool Parser::parseExtGNU_AttributeSpecifier_AtFirst(SpecifierSyntax*& spec)
{
    DBG_THIS_RULE();
    PSY_ASSERT_3(peek().kind() == SyntaxKind::Keyword_ExtGNU___attribute__,
                  return false,
                  "assert failure: `__attribute__'");

    auto attrSpec = makeNode<ExtGNU_AttributeSpecifierSyntax>();
    spec = attrSpec;
    attrSpec->attrKwTkIdx_ = consume();

    if (match(SyntaxKind::OpenParenToken, &attrSpec->openOuterParenTkIdx_)
            && match(SyntaxKind::OpenParenToken, &attrSpec->openInnerParenTkIdx_)
            && parseExtGNU_AttributeList(attrSpec->attrs_)
            && match(SyntaxKind::CloseParenToken, &attrSpec->closeInnerParenTkIdx_)
            && match(SyntaxKind::CloseParenToken, &attrSpec->closeOuterParenTkIdx_))
        return true;

    skipTo(SyntaxKind::CloseParenToken);
    return false;
}